

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  byte bVar2;
  FILE *__stream;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  uint uVar10;
  BrotliDecoderResult BVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  size_t sVar15;
  void *pvVar16;
  BrotliDecoderState *state;
  BrotliEncoderState *state_00;
  char **result;
  undefined8 *puVar17;
  byte *s;
  int iVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  size_t sStackY_1d0;
  int local_1b0;
  int local_1a0;
  uint local_198;
  ulong local_178;
  ulong local_170;
  undefined1 local_168 [28];
  undefined8 uStack_14c;
  int iStack_144;
  byte *local_140;
  byte *local_138;
  int aiStack_130 [20];
  ulong local_e0;
  ulong local_d8;
  int local_d0;
  char **local_c8;
  undefined1 local_c0 [16];
  int local_b0;
  uint8_t *local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  undefined1 local_90 [16];
  ulong local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  size_t local_58;
  uint8_t *local_50;
  undefined1 local_48 [16];
  
  local_168._0_8_ = 0xffffffff0000000b;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_8_ = 0x100000000;
  local_140 = (byte *)0x0;
  stack0xfffffffffffffeb0 = (undefined1  [16])0x0;
  local_138 = (byte *)0x1400a8;
  for (lVar13 = 0xe; lVar13 != 0x22; lVar13 = lVar13 + 1) {
    *(undefined4 *)(local_168 + lVar13 * 4) = 0;
  }
  local_e0 = 1;
  local_d8 = 0;
  local_a8 = (uint8_t *)0x0;
  local_b0 = 0;
  local_c0 = (undefined1  [16])0x0;
  local_90 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_d0 = argc;
  local_c8 = argv;
  pcVar14 = FileName(*argv);
  iVar8 = strncmp(pcVar14,"unbrotli",8);
  bVar21 = false;
  local_198 = 0;
  if (iVar8 == 0) {
    local_198 = (uint)(pcVar14[8] == '\0' || pcVar14[8] == '.');
  }
  iVar8 = 1;
  local_170 = 0;
  local_178 = 1;
  local_1b0 = 0;
  bVar5 = false;
  bVar6 = false;
  local_1a0 = 0;
  bVar4 = false;
  bVar3 = false;
  iVar18 = 0;
  uVar12 = 3;
LAB_001024b0:
  pbVar1 = local_138;
  auVar7 = stack0xfffffffffffffeb0;
  if (argc <= iVar8) goto LAB_00102b87;
  pcVar14 = argv[iVar8];
  if ((pcVar14 == (char *)0x0) || (result = argv, sVar15 = strlen(pcVar14), sVar15 == 0)) {
    aiStack_130[iVar18] = iVar8;
    iVar18 = iVar18 + 1;
  }
  else {
    if (0x12 < iVar18) {
      pcVar14 = "too many options passed\n";
      sStackY_1d0 = 0x18;
      goto LAB_0010322e;
    }
    if (((bVar3) || (sVar15 == 1)) || (*pcVar14 != '-')) {
      local_170 = local_170 + 1;
      if (local_178 <= sVar15) {
        local_178 = sVar15;
      }
    }
    else {
      iVar19 = iVar18 + 1;
      aiStack_130[iVar18] = iVar8;
      iVar18 = iVar19;
      if (sVar15 == 2) {
        if (pcVar14[1] == '-') {
          bVar3 = true;
          goto LAB_00102513;
        }
LAB_0010272d:
        for (uVar20 = 1; uVar20 < sVar15; uVar20 = uVar20 + 1) {
          bVar2 = pcVar14[uVar20];
          bVar3 = bVar21;
          if ((byte)(bVar2 - 0x30) < 10) {
            if (local_1b0 == 0) {
              local_168._0_4_ = (char)bVar2 + -0x30;
LAB_00102760:
              local_1b0 = 1;
              goto LAB_00102767;
            }
            goto LAB_00102ef3;
          }
          switch(bVar2) {
          case 99:
            if (bVar5) goto LAB_00102f23;
            local_168._24_4_ = 1;
            bVar5 = true;
            break;
          case 100:
            local_198 = 1;
            bVar3 = true;
            if (bVar21) {
              pcVar14 = "command already set when parsing -d\n";
              goto LAB_0010322c;
            }
            break;
          default:
            if ((bVar2 & 0xfe) == 0x6a) {
              if (!bVar6) {
                local_168._17_3_ = 0;
                local_168[0x10] = bVar2 == 0x6a;
                bVar6 = true;
                break;
              }
              goto LAB_001031f1;
            }
            switch(bVar2) {
            case 0x6e:
              if (local_168._20_4_ == 0) goto LAB_001033ff;
              local_168._16_8_ = local_168._16_8_ & 0xffffffff;
              break;
            case 0x6f:
            case 0x71:
            case 0x77:
              goto switchD_00102816_caseD_6f;
            case 0x70:
            case 0x72:
            case 0x73:
            case 0x75:
switchD_00102816_caseD_70:
              pcVar14 = "invalid argument -%c\n";
              goto LAB_001031e8;
            case 0x74:
              local_198 = 4;
              bVar3 = true;
              if (bVar21) {
                pcVar14 = "command already set when parsing -t\n";
                goto LAB_0010322c;
              }
              break;
            case 0x76:
              if (0 < (int)local_168._8_4_) goto LAB_00103417;
              local_168._8_4_ = 1;
              break;
            default:
              if ((bVar2 != 0x44) && (bVar2 != 0x53)) {
                if (bVar2 == 0x5a) {
                  if (local_1b0 == 0) {
                    local_168._0_4_ = 0xb;
                    goto LAB_00102760;
                  }
                  goto LAB_00102ef3;
                }
                if (bVar2 != 0x56) goto switchD_00102816_caseD_70;
                goto LAB_0010337f;
              }
switchD_00102816_caseD_6f:
              if (((((2 - sVar15) + uVar20 != 1) || (iVar8 = iVar8 + 1, iVar8 == argc)) ||
                  (s = (byte *)argv[iVar8], s == (byte *)0x0)) || (*s == 0)) {
                pcVar14 = "expected parameter for argument -%c\n";
LAB_001031e8:
                fprintf(_stderr,pcVar14);
                goto LAB_00103237;
              }
              lVar13 = (long)iVar19;
              iVar19 = iVar19 + 1;
              aiStack_130[lVar13] = iVar8;
              if (bVar2 == 0x53) {
                if (bVar4) goto LAB_001033d1;
                bVar4 = true;
                local_138 = s;
              }
              else if (bVar2 == 0x77) {
                if (local_1a0 != 0) goto LAB_0010342d;
                local_1a0 = ParseInt((char *)s,0x18,(int)local_168 + 4,(int *)argv);
                if (local_1a0 == 0) {
                  pcVar14 = "error parsing lgwin value [%s]\n";
                  goto LAB_001034bc;
                }
                if ((int)local_168._4_4_ < 10 && local_168._4_4_ != 0) goto LAB_00103445;
              }
              else if (bVar2 == 0x71) {
                if (local_1b0 != 0) goto LAB_00102ef3;
                local_1b0 = ParseInt((char *)s,0xb,(int)local_168,(int *)argv);
                if (local_1b0 == 0) {
                  pcVar14 = "error parsing quality value [%s]\n";
                  goto LAB_001034bc;
                }
              }
              else if (bVar2 == 0x6f) {
                if (bVar5) {
                  pcVar14 = "write to standard output already set (-o)\n";
                  sStackY_1d0 = 0x2a;
                  goto LAB_0010322e;
                }
                bVar5 = false;
                local_140 = s;
              }
            }
            break;
          case 0x66:
            if (local_168._12_4_ != 0) goto LAB_00103206;
            local_168._12_4_ = 1;
            break;
          case 0x68:
            goto switchD_00102785_caseD_68;
          }
LAB_00102767:
          bVar21 = bVar3;
        }
      }
      else {
        if (pcVar14[1] != '-') goto LAB_0010272d;
        pbVar1 = (byte *)(pcVar14 + 2);
        iVar9 = strcmp("best",(char *)pbVar1);
        if (iVar9 == 0) {
          if (local_1b0 != 0) {
LAB_00102ef3:
            pcVar14 = "quality already set\n";
            sStackY_1d0 = 0x14;
            goto LAB_0010322e;
          }
          local_168._0_4_ = 0xb;
          bVar3 = false;
          local_1b0 = 1;
          goto LAB_00102513;
        }
        iVar9 = strcmp("decompress",(char *)pbVar1);
        if (iVar9 == 0) {
          if (bVar21) {
            pcVar14 = "command already set when parsing --decompress\n";
LAB_00103202:
            sStackY_1d0 = 0x2e;
            goto LAB_0010322e;
          }
          bVar3 = false;
          local_198 = 1;
          bVar21 = true;
          goto LAB_00102513;
        }
        iVar9 = strcmp("force",(char *)pbVar1);
        if (iVar9 == 0) {
          if (local_168._12_4_ == 0) {
            local_168._12_4_ = 1;
            goto LAB_00102a3b;
          }
LAB_00103206:
          pcVar14 = "force output overwrite already set\n";
          sStackY_1d0 = 0x23;
          goto LAB_0010322e;
        }
        iVar9 = strcmp("help",(char *)pbVar1);
        if (iVar9 == 0) {
switchD_00102785_caseD_68:
          uVar12 = 2;
          goto LAB_00103237;
        }
        iVar9 = strcmp("keep",(char *)pbVar1);
        if (iVar9 == 0) {
          if (!bVar6) {
            local_168._16_8_ = local_168._16_8_ & 0xffffffff00000000;
LAB_00102a5b:
            bVar3 = false;
            bVar6 = true;
            goto LAB_00102513;
          }
LAB_001031f1:
          pcVar14 = "argument --rm / -j or --keep / -k already set\n";
          goto LAB_00103202;
        }
        iVar9 = strcmp("no-copy-stat",(char *)pbVar1);
        if (iVar9 == 0) {
          if (local_168._20_4_ != 0) {
            local_168._16_8_ = local_168._16_8_ & 0xffffffff;
            goto LAB_00102a3b;
          }
LAB_001033ff:
          pcVar14 = "argument --no-copy-stat / -n already set\n";
          sStackY_1d0 = 0x29;
          goto LAB_0010322e;
        }
        uVar10 = *pbVar1 - 0x72;
        if ((uVar10 == 0) && (uVar10 = (byte)pcVar14[3] - 0x6d, uVar10 == 0)) {
          uVar10 = (uint)(byte)pcVar14[4];
        }
        if (uVar10 == 0) {
          if (!bVar6) {
            local_168._16_4_ = 1;
            goto LAB_00102a5b;
          }
          goto LAB_001031f1;
        }
        iVar9 = strcmp("stdout",(char *)pbVar1);
        if (iVar9 == 0) {
          if (!bVar5) {
            local_168._24_4_ = 1;
            bVar3 = false;
            bVar5 = true;
            goto LAB_00102513;
          }
LAB_00102f23:
          pcVar14 = "write to standard output already set\n";
          sStackY_1d0 = 0x25;
LAB_0010322e:
          fwrite(pcVar14,sStackY_1d0,1,_stderr);
          goto LAB_00103237;
        }
        iVar9 = strcmp("test",(char *)pbVar1);
        if (iVar9 == 0) {
          if (!bVar21) {
            bVar3 = false;
            bVar21 = true;
            local_198 = 4;
            goto LAB_00102513;
          }
          pcVar14 = "command already set when parsing --test\n";
          sStackY_1d0 = 0x28;
          goto LAB_0010322e;
        }
        iVar9 = strcmp("verbose",(char *)pbVar1);
        if (iVar9 == 0) {
          if ((int)local_168._8_4_ < 1) {
            local_168._8_4_ = 1;
            goto LAB_00102a3b;
          }
LAB_00103417:
          pcVar14 = "argument --verbose / -v already set\n";
LAB_0010322c:
          sStackY_1d0 = 0x24;
          goto LAB_0010322e;
        }
        iVar9 = strcmp("version",(char *)pbVar1);
        if (iVar9 == 0) {
LAB_0010337f:
          bVar21 = false;
          fprintf(_stdout,"brotli %d.%d.%d\n",1,0,7);
          goto LAB_00103332;
        }
        pcVar14 = strrchr((char *)pbVar1,0x3d);
        if ((pcVar14 == (char *)0x0) || (pcVar14[1] == '\0')) {
          pcVar14 = "must pass the parameter as --%s=value\n";
          s = pbVar1;
          goto LAB_001034bc;
        }
        s = (byte *)(pcVar14 + 1);
        sVar15 = (long)pcVar14 - (long)pbVar1;
        iVar9 = strncmp("lgwin",(char *)pbVar1,sVar15);
        if (iVar9 != 0) {
          iVar9 = strncmp("large_window",(char *)pbVar1,sVar15);
          if (iVar9 == 0) {
            if (local_1a0 == 0) {
              iVar18 = 0x1e;
              goto LAB_00102af7;
            }
LAB_0010342d:
            pcVar14 = "lgwin parameter already set\n";
            sStackY_1d0 = 0x1c;
            goto LAB_0010322e;
          }
          iVar9 = strncmp("output",(char *)pbVar1,sVar15);
          if (iVar9 != 0) {
            iVar9 = strncmp("quality",(char *)pbVar1,sVar15);
            if (iVar9 == 0) {
              if (local_1b0 != 0) goto LAB_00102ef3;
              local_1b0 = ParseInt((char *)s,0xb,(int)local_168,(int *)result);
              if (local_1b0 != 0) goto LAB_00102a3b;
              pcVar14 = "error parsing quality value [%s]\n";
            }
            else {
              iVar19 = strncmp("suffix",(char *)pbVar1,sVar15);
              if (iVar19 == 0) {
                if (!bVar4) {
                  bVar3 = false;
                  bVar4 = true;
                  local_138 = s;
                  goto LAB_00102513;
                }
LAB_001033d1:
                pcVar14 = "suffix already set\n";
                sStackY_1d0 = 0x13;
                goto LAB_0010322e;
              }
              pcVar14 = "invalid parameter: [%s]\n";
              s = pbVar1;
            }
            goto LAB_001034bc;
          }
          if (bVar5) {
            pcVar14 = "write to standard output already set (--output)\n";
            sStackY_1d0 = 0x30;
            goto LAB_0010322e;
          }
          bVar5 = false;
          local_140 = s;
          goto LAB_00102a3b;
        }
        if (local_1a0 != 0) goto LAB_0010342d;
        iVar18 = 0x18;
LAB_00102af7:
        local_1a0 = ParseInt((char *)s,iVar18,(int)local_168 + 4,(int *)result);
        if (local_1a0 == 0) {
          pcVar14 = "error parsing lgwin value [%s]\n";
LAB_001034bc:
          fprintf(_stderr,pcVar14,s);
          goto LAB_00103237;
        }
        if ((int)local_168._4_4_ < 10 && local_168._4_4_ != 0) {
LAB_00103445:
          fprintf(_stderr,"lgwin parameter (%d) smaller than the minimum (%d)\n",
                  (ulong)(uint)local_168._4_4_,10);
          goto LAB_00103237;
        }
      }
LAB_00102a3b:
      bVar3 = false;
      iVar18 = iVar19;
    }
  }
LAB_00102513:
  iVar8 = iVar8 + 1;
  goto LAB_001024b0;
LAB_001031ca:
  bVar21 = false;
  goto LAB_00103332;
LAB_00102b87:
  local_d8 = local_170;
  local_e0 = local_178;
  uStack_14c._4_4_ = -(uint)(local_198 == 1) >> 0x1f;
  uStack_14c._0_4_ = -(uint)(local_198 == 4) >> 0x1f;
  iStack_144 = auVar7._12_4_;
  local_168._24_4_ = auVar7._0_4_;
  if ((local_170 < 2 || !bVar5) &&
     ((((local_198 != 4 || ((local_140 == (byte *)0x0 && (local_168._24_4_ == 0)))) &&
       (pcVar14 = strchr((char *)local_138,0x2f), pcVar14 == (char *)0x0)) &&
      (((pcVar14 = strchr((char *)pbVar1,0x5c), pcVar14 == (char *)0x0 &&
        (uVar12 = local_198, local_198 < 5)) && ((0x13U >> local_198 & 1) != 0)))))) {
    sVar15 = strlen((char *)pbVar1);
    pvVar16 = malloc(local_178 + sVar15 + 1);
    local_c0._0_8_ = pvVar16;
    local_a8 = (uint8_t *)malloc(0x100000);
    if ((pvVar16 == (void *)0x0) || (local_a8 == (uint8_t *)0x0)) {
LAB_001033aa:
      fwrite("out of memory\n",0xe,1,_stderr);
      bVar21 = true;
      goto LAB_00103332;
    }
    local_98 = local_a8 + 0x80000;
    local_a0 = local_a8;
    if (local_198 == 0) {
      do {
        iVar8 = NextFile((Context *)local_168);
        bVar21 = iVar8 != 0;
        if (iVar8 == 0) goto LAB_001031ca;
        state_00 = BrotliEncoderCreateInstance
                             ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (state_00 == (BrotliEncoderState *)0x0) goto LAB_001033aa;
        BrotliEncoderSetParameter(state_00,BROTLI_PARAM_QUALITY,local_168._0_4_);
        uVar20 = (ulong)(uint)local_168._4_4_;
        if ((int)local_168._4_4_ < 1) {
          uVar20 = 0x18;
          if (-1 < (long)local_80) {
            uVar20 = 10;
            do {
              if (local_80 <= (1L << ((byte)uVar20 & 0x3f)) - 0x10U) goto LAB_00102fe8;
              uVar20 = uVar20 + 1;
            } while (uVar20 != 0x18);
            uVar20 = 0x18;
          }
        }
        else if (0x18 < (uint)local_168._4_4_) {
          BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LARGE_WINDOW,1);
          uVar20 = (ulong)local_168._0_8_ >> 0x20;
        }
LAB_00102fe8:
        BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LGWIN,(uint32_t)uVar20);
        if (0 < (long)local_80) {
          uVar20 = local_80;
          if (0x3fffffff < local_80) {
            uVar20 = 0x40000000;
          }
          BrotliEncoderSetParameter(state_00,BROTLI_PARAM_SIZE_HINT,(uint32_t)uVar20);
        }
        iVar8 = OpenFiles((Context *)local_168);
        if (iVar8 == 0) {
LAB_00103164:
          bVar3 = false;
          iVar8 = 0;
        }
        else {
          if ((((char *)local_90._8_8_ == (char *)0x0) && (local_168._12_4_ == 0)) &&
             (iVar8 = isatty(1), iVar8 != 0)) {
            fwrite("Use -h help. Use -f to force output to a terminal.\n",0x33,1,_stderr);
            goto LAB_00103164;
          }
          local_68 = (undefined1  [16])0x0;
          local_58 = 0x80000;
          local_50 = local_98;
          local_48 = (undefined1  [16])0x0;
          uVar12 = 0;
          do {
            if ((uVar12 == 0) && (local_68._0_8_ == 0)) {
              iVar8 = ProvideInput((Context *)local_168);
              if (iVar8 == 0) goto LAB_00103164;
              uVar12 = HasMoreInput((Context *)local_168);
              uVar12 = uVar12 ^ 1;
            }
            iVar8 = BrotliEncoderCompressStream
                              (state_00,(uint)(uVar12 != 0) * 2,(size_t *)local_68,
                               (uint8_t **)(local_68 + 8),&local_58,&local_50,(size_t *)0x0);
            if (iVar8 == 0) {
              pcVar14 = (char *)local_90._0_8_;
              if ((char *)local_90._0_8_ == (char *)0x0) {
                pcVar14 = "con";
              }
              fprintf(_stderr,"failed to compress data [%s]\n",pcVar14);
              goto LAB_00103164;
            }
            if ((local_58 == 0) && (iVar8 = ProvideOutput((Context *)local_168), iVar8 == 0))
            goto LAB_00103164;
            iVar8 = BrotliEncoderIsFinished(state_00);
          } while (iVar8 == 0);
          iVar8 = FlushOutput((Context *)local_168);
          if (iVar8 == 0) goto LAB_00103164;
          bVar3 = true;
          if (0 < (int)local_168._8_4_) {
            fwrite("Compressed ",0xb,1,_stderr);
            PrintFileProcessingProgress((Context *)local_168);
            fputc(10,_stderr);
          }
          iVar8 = 1;
        }
        BrotliEncoderDestroyInstance(state_00);
        iVar8 = CloseFiles((Context *)local_168,iVar8);
      } while ((bVar3) && (iVar8 != 0));
      goto LAB_00103332;
    }
    if ((local_198 == 1) || (local_198 == 4)) {
      do {
        iVar8 = NextFile((Context *)local_168);
        bVar21 = iVar8 != 0;
        if (!bVar21) goto LAB_001031ca;
        state = BrotliDecoderCreateInstance
                          ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
        if (state == (BrotliDecoderState *)0x0) goto LAB_001033aa;
        BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,1);
        BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,0);
        iVar8 = OpenFiles((Context *)local_168);
        if (iVar8 == 0) {
LAB_00102de7:
          iVar8 = 0;
          bVar3 = false;
        }
        else {
          if ((((char *)local_90._0_8_ == (char *)0x0) && (local_168._12_4_ == 0)) &&
             (iVar8 = isatty(0), iVar8 != 0)) {
            fwrite("Use -h help. Use -f to force input from a terminal.\n",0x34,1,_stderr);
            goto LAB_00102de7;
          }
          local_68 = (undefined1  [16])0x0;
          local_58 = 0x80000;
          local_50 = local_98;
          local_48 = (undefined1  [16])0x0;
          BVar11 = BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
LAB_00102d9b:
          if (BVar11 == BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT) {
            iVar8 = HasMoreInput((Context *)local_168);
            if (iVar8 != 0) {
              iVar8 = ProvideInput((Context *)local_168);
              goto LAB_00102dc7;
            }
          }
          else {
            if (BVar11 == BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT) {
              iVar8 = ProvideOutput((Context *)local_168);
LAB_00102dc7:
              if (iVar8 == 0) goto LAB_00102e34;
              BVar11 = BrotliDecoderDecompressStream
                                 (state,(size_t *)local_68,(uint8_t **)(local_68 + 8),&local_58,
                                  &local_50,(size_t *)0x0);
              goto LAB_00102d9b;
            }
            if (BVar11 != BROTLI_DECODER_RESULT_SUCCESS) goto LAB_00102e60;
            iVar8 = FlushOutput((Context *)local_168);
            if (iVar8 == 0) goto LAB_00102e34;
            if (local_68._0_8_ == 0) {
              iVar8 = fgetc((FILE *)local_78._0_8_);
              if (iVar8 == -1) {
                bVar3 = true;
                if (0 < (int)local_168._8_4_) {
                  fwrite("Decompressed ",0xd,1,_stderr);
                  PrintFileProcessingProgress((Context *)local_168);
                  fputc(10,_stderr);
                }
                iVar8 = 1;
                goto LAB_00102e37;
              }
            }
          }
LAB_00102e60:
          pcVar14 = (char *)local_90._0_8_;
          if ((char *)local_90._0_8_ == (char *)0x0) {
            pcVar14 = "con";
          }
          fprintf(_stderr,"corrupt input [%s]\n",pcVar14);
LAB_00102e34:
          bVar3 = false;
          iVar8 = 0;
        }
LAB_00102e37:
        BrotliDecoderDestroyInstance(state);
        iVar8 = CloseFiles((Context *)local_168,iVar8);
      } while ((bVar3) && (iVar8 != 0));
      goto LAB_00103332;
    }
  }
LAB_00103237:
  pcVar14 = FileName(*argv);
  bVar21 = uVar12 != 2;
  if (uVar12 == 2) {
    puVar17 = (undefined8 *)&stderr;
  }
  else {
    puVar17 = (undefined8 *)&stdout;
  }
  __stream = (FILE *)*puVar17;
  fprintf(__stream,"Usage: %s [OPTION]... [FILE]...\n",pcVar14);
  fwrite("Options:\n  -#                          compression level (0-9)\n  -c, --stdout                write on standard output\n  -d, --decompress            decompress\n  -f, --force                 force output file overwrite\n  -h, --help                  display this help and exit\n"
         ,0x112,1,__stream);
  fwrite("  -j, --rm                    remove source file(s)\n  -k, --keep                  keep source file(s) (default)\n  -n, --no-copy-stat          do not copy source file(s) attributes\n  -o FILE, --output=FILE      output file (only if 1 input file)\n"
         ,0xf5,1,__stream);
  fprintf(__stream,"  -q NUM, --quality=NUM       compression level (%d-%d)\n",0,0xb);
  fwrite("  -t, --test                  test compressed file integrity\n  -v, --verbose               verbose mode\n"
         ,0x68,1,__stream);
  fprintf(__stream,
          "  -w NUM, --lgwin=NUM         set LZ77 window size (0, %d-%d)\n                              window size = 2**NUM - 16\n                              0 lets compressor choose the optimal value\n"
          ,10,0x18);
  fprintf(__stream,
          "  --large_window=NUM          use incompatible large-window brotli\n                              bitstream with window size (0, %d-%d)\n                              WARNING: this format is not compatible\n                              with brotli RFC 7932 and may not be\n                              decodable with regular brotli decoders\n"
          ,10,0x1e);
  fprintf(__stream,"  -S SUF, --suffix=SUF        output file suffix (default:\'%s\')\n",".br");
  fwrite("  -V, --version               display version and exit\n  -Z, --best                  use best compression level (11) (default)\nSimple options could be coalesced, i.e. \'-9kf\' is equivalent to \'-9 -k -f\'.\nWith no FILE, or when FILE is -, read standard input.\nAll arguments after \'--\' are treated as files.\n"
         ,0x130,1,__stream);
LAB_00103332:
  iVar8 = local_b0;
  free((void *)local_c0._0_8_);
  free(local_a8);
  if ((!bVar21) && (iVar8 == 0)) {
    return 0;
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  Command command;
  Context context;
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  int i;

  context.quality = 11;
  context.lgwin = -1;
  context.verbosity = 0;
  context.force_overwrite = BROTLI_FALSE;
  context.junk_source = BROTLI_FALSE;
  context.copy_stat = BROTLI_TRUE;
  context.test_integrity = BROTLI_FALSE;
  context.write_to_stdout = BROTLI_FALSE;
  context.decompress = BROTLI_FALSE;
  context.large_window = BROTLI_FALSE;
  context.output_path = NULL;
  context.suffix = DEFAULT_SUFFIX;
  for (i = 0; i < MAX_OPTIONS; ++i) context.not_input_indices[i] = 0;
  context.longest_path_len = 1;
  context.input_count = 0;

  context.argc = argc;
  context.argv = argv;
  context.modified_path = NULL;
  context.iterator = 0;
  context.ignore = 0;
  context.iterator_error = BROTLI_FALSE;
  context.buffer = NULL;
  context.current_input_path = NULL;
  context.current_output_path = NULL;
  context.fin = NULL;
  context.fout = NULL;

  command = ParseParams(&context);

  if (command == COMMAND_COMPRESS || command == COMMAND_DECOMPRESS ||
      command == COMMAND_TEST_INTEGRITY) {
    if (is_ok) {
      size_t modified_path_len =
          context.longest_path_len + strlen(context.suffix) + 1;
      context.modified_path = (char*)malloc(modified_path_len);
      context.buffer = (uint8_t*)malloc(kFileBufferSize * 2);
      if (!context.modified_path || !context.buffer) {
        fprintf(stderr, "out of memory\n");
        is_ok = BROTLI_FALSE;
      } else {
        context.input = context.buffer;
        context.output = context.buffer + kFileBufferSize;
      }
    }
  }

  if (!is_ok) command = COMMAND_NOOP;

  switch (command) {
    case COMMAND_NOOP:
      break;

    case COMMAND_VERSION:
      PrintVersion();
      break;

    case COMMAND_COMPRESS:
      is_ok = CompressFiles(&context);
      break;

    case COMMAND_DECOMPRESS:
    case COMMAND_TEST_INTEGRITY:
      is_ok = DecompressFiles(&context);
      break;

    case COMMAND_HELP:
    case COMMAND_INVALID:
    default:
      is_ok = (command == COMMAND_HELP);
      PrintHelp(FileName(argv[0]), is_ok);
      break;
  }

  if (context.iterator_error) is_ok = BROTLI_FALSE;

  free(context.modified_path);
  free(context.buffer);

  if (!is_ok) exit(1);
  return 0;
}